

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_awareness(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  short *psVar1;
  monster_sex_t mVar2;
  char *pcVar3;
  short *psVar4;
  
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x5a0,
                  "void lore_append_awareness(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar2 = lore_monster_sex(race);
  if (lore->sleep_known != true) {
    return;
  }
  pcVar3 = "is ever vigilant for";
  psVar1 = &lore_describe_awareness_lore_awareness_description;
  do {
    psVar4 = psVar1;
    if (*psVar4 == 0x7fff) goto LAB_0017337b;
    psVar1 = psVar4 + 8;
  } while ((short)race->sleep <= *psVar4);
  pcVar3 = *(char **)(psVar4 + 4);
LAB_0017337b:
  textblock_append(tb,"%s %s intruders, which %s may notice from ",
                   *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + (ulong)mVar2 * 0x10 + 8),
                   pcVar3,*(undefined8 *)
                           (lore_pronoun_nominative_lore_pronouns + (ulong)mVar2 * 0x10));
  textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)(race->hearing * 10));
  textblock_append(tb," feet.  ");
  return;
}

Assistant:

void lore_append_awareness(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Do we know how aware it is? */
	if (lore->sleep_known)
	{
		const char *aware = lore_describe_awareness(race->sleep);
		textblock_append(tb, "%s %s intruders, which %s may notice from ",
						 lore_pronoun_nominative(msex, true), aware,
						 lore_pronoun_nominative(msex, false));
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", 10 * race->hearing);
		textblock_append(tb, " feet.  ");
	}
}